

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::FieldMaskUtil::SnakeCaseToCamelCase
          (FieldMaskUtil *this,string_view input,string *output)

{
  FieldMaskUtil FVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  FieldMaskUtil *pFVar5;
  
  pcVar3 = input._M_str;
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  **(undefined1 **)pcVar3 = 0;
  pFVar5 = (FieldMaskUtil *)0x0;
  bVar4 = false;
  do {
    if (this == pFVar5) {
      return (bool)(bVar4 ^ 1);
    }
    FVar1 = pFVar5[input._M_len];
    if ((byte)((char)FVar1 + 0xbfU) < 0x1a) {
      return false;
    }
    if (bVar4) {
      if (0x19 < (byte)((char)FVar1 + 0x9fU)) {
        return false;
      }
      bVar4 = false;
LAB_00cc5640:
      std::__cxx11::string::push_back((char)input._M_str);
      bVar2 = bVar4;
    }
    else {
      bVar2 = true;
      if (FVar1 != (FieldMaskUtil)0x5f) goto LAB_00cc5640;
    }
    bVar4 = bVar2;
    pFVar5 = pFVar5 + 1;
  } while( true );
}

Assistant:

bool FieldMaskUtil::SnakeCaseToCamelCase(absl::string_view input,
                                         std::string* output) {
  output->clear();
  bool after_underscore = false;
  for (char input_char : input) {
    if (input_char >= 'A' && input_char <= 'Z') {
      // The field name must not contain uppercase letters.
      return false;
    }
    if (after_underscore) {
      if (input_char >= 'a' && input_char <= 'z') {
        output->push_back(input_char + 'A' - 'a');
        after_underscore = false;
      } else {
        // The character after a "_" must be a lowercase letter.
        return false;
      }
    } else if (input_char == '_') {
      after_underscore = true;
    } else {
      output->push_back(input_char);
    }
  }
  if (after_underscore) {
    // Trailing "_".
    return false;
  }
  return true;
}